

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_linearsolver.c
# Opt level: O0

SUNLinearSolver SUNLinSolNewEmpty(SUNContext_conflict sunctx)

{
  SUNLinearSolver_Ops p_Var1;
  SUNContext in_RDI;
  SUNContext_conflict sunctx_local_scope_;
  SUNLinearSolver_Ops ops;
  SUNLinearSolver LS;
  SUNLinearSolver local_8;
  
  if (in_RDI == (SUNContext)0x0) {
    local_8 = (SUNLinearSolver)0x0;
  }
  else {
    local_8 = (SUNLinearSolver)malloc(0x18);
    p_Var1 = (SUNLinearSolver_Ops)malloc(0x78);
    p_Var1->gettype = (_func_SUNLinearSolver_Type_SUNLinearSolver *)0x0;
    p_Var1->getid = (_func_SUNLinearSolver_ID_SUNLinearSolver *)0x0;
    p_Var1->setatimes = (_func_SUNErrCode_SUNLinearSolver_void_ptr_SUNATimesFn *)0x0;
    p_Var1->setpreconditioner =
         (_func_SUNErrCode_SUNLinearSolver_void_ptr_SUNPSetupFn_SUNPSolveFn *)0x0;
    p_Var1->setscalingvectors = (_func_SUNErrCode_SUNLinearSolver_N_Vector_N_Vector *)0x0;
    p_Var1->setzeroguess = (_func_SUNErrCode_SUNLinearSolver_int *)0x0;
    p_Var1->initialize = (_func_SUNErrCode_SUNLinearSolver *)0x0;
    p_Var1->setup = (_func_int_SUNLinearSolver_SUNMatrix *)0x0;
    p_Var1->solve = (_func_int_SUNLinearSolver_SUNMatrix_N_Vector_N_Vector_sunrealtype *)0x0;
    p_Var1->numiters = (_func_int_SUNLinearSolver *)0x0;
    p_Var1->resnorm = (_func_sunrealtype_SUNLinearSolver *)0x0;
    p_Var1->resid = (_func_N_Vector_SUNLinearSolver *)0x0;
    p_Var1->lastflag = (_func_sunindextype_SUNLinearSolver *)0x0;
    p_Var1->space = (_func_SUNErrCode_SUNLinearSolver_long_ptr_long_ptr *)0x0;
    p_Var1->free = (_func_SUNErrCode_SUNLinearSolver *)0x0;
    local_8->ops = p_Var1;
    local_8->content = (void *)0x0;
    local_8->sunctx = in_RDI;
  }
  return local_8;
}

Assistant:

SUNLinearSolver SUNLinSolNewEmpty(SUNContext sunctx)
{
  SUNLinearSolver LS;
  SUNLinearSolver_Ops ops;

  if (sunctx == NULL) { return NULL; }

  SUNFunctionBegin(sunctx);

  /* create linear solver object */
  LS = NULL;
  LS = (SUNLinearSolver)malloc(sizeof *LS);
  SUNAssertNull(LS, SUN_ERR_MALLOC_FAIL);

  /* create linear solver ops structure */
  ops = NULL;
  ops = (SUNLinearSolver_Ops)malloc(sizeof *ops);
  SUNAssertNull(ops, SUN_ERR_MALLOC_FAIL);

  /* initialize operations to NULL */
  ops->gettype           = NULL;
  ops->getid             = NULL;
  ops->setatimes         = NULL;
  ops->setpreconditioner = NULL;
  ops->setscalingvectors = NULL;
  ops->setzeroguess      = NULL;
  ops->initialize        = NULL;
  ops->setup             = NULL;
  ops->solve             = NULL;
  ops->numiters          = NULL;
  ops->resnorm           = NULL;
  ops->resid             = NULL;
  ops->lastflag          = NULL;
  ops->space             = NULL;
  ops->free              = NULL;

  /* attach ops and initialize content and context to NULL */
  LS->ops     = ops;
  LS->content = NULL;
  LS->sunctx  = sunctx;

  return (LS);
}